

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O2

int __thiscall cmCTestMemCheckHandler::PostProcessHandler(cmCTestMemCheckHandler *this)

{
  cmCTest *this_00;
  int iVar1;
  ostream *poVar2;
  char *local_1a8 [4];
  ostringstream cmCTestLog_msg;
  
  iVar1 = cmCTestTestHandler::ExecuteCommands
                    (&this->super_cmCTestTestHandler,&this->CustomPostMemCheck);
  if (iVar1 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar2 = std::operator<<((ostream *)&cmCTestLog_msg,
                             "Problem executing post-memcheck command(s).");
    std::endl<char,std::char_traits<char>>(poVar2);
    this_00 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(this_00,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestMemCheckHandler.cxx"
                 ,0x9b,local_1a8[0],false);
    std::__cxx11::string::~string((string *)local_1a8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  }
  return (uint)(iVar1 != 0);
}

Assistant:

int cmCTestMemCheckHandler::PostProcessHandler()
{
  if (!this->ExecuteCommands(this->CustomPostMemCheck)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Problem executing post-memcheck command(s)." << std::endl);
    return 0;
  }
  return 1;
}